

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O3

ptags * __thiscall
lest::for_test<lest::ptags>(lest *this,tests *specification,texts *in,ptags *perform,int n)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  fd_set *__exceptfds;
  fd_set *__writefds;
  long *plVar5;
  long *plVar6;
  int iVar7;
  undefined4 in_register_00000084;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  test local_70;
  
  iVar4 = (int)perform;
  __exceptfds = (fd_set *)CONCAT71((int7)((ulong)perform >> 8),iVar4 < 1);
  if (iVar4 == -1 || iVar4 >= 1) {
    plVar6 = *(long **)(this + 8);
    iVar7 = 0;
    do {
      plVar5 = *(long **)this;
      if (plVar5 != plVar6) {
        do {
          local_90[0] = local_80;
          std::__cxx11::string::_M_construct<char*>((string *)local_90,*plVar5,plVar5[1] + *plVar5);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&stack0xffffffffffffffb8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)specification);
          iVar2 = select((int)(string *)local_90,(fd_set *)&stack0xffffffffffffffb8,__writefds,
                         __exceptfds,(timeval *)CONCAT44(in_register_00000084,n));
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&stack0xffffffffffffffb8);
          if (local_90[0] != local_80) {
            operator_delete(local_90[0]);
          }
          paVar1 = &local_70.name.field_2;
          if ((char)iVar2 != '\0') {
            local_70.name._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_70,*plVar5,plVar5[1] + *plVar5);
            local_70.behaviour = (_func_void_env_ptr *)plVar5[4];
            ptags::operator()((ptags *)in,&local_70);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70.name._M_dataplus._M_p != paVar1) {
              operator_delete(local_70.name._M_dataplus._M_p);
            }
          }
          plVar6 = plVar5 + 5;
          plVar5 = plVar6;
        } while (plVar6 != *(long **)(this + 8));
      }
      iVar7 = iVar7 + 1;
      bVar3 = iVar7 < iVar4 || iVar4 == -1;
      __exceptfds = (fd_set *)(ulong)CONCAT31((int3)((ulong)perform >> 8),bVar3);
    } while (bVar3);
  }
  return (ptags *)in;
}

Assistant:

Action & for_test( tests specification, texts in, Action & perform, int n = 1 )
{
    for ( int i = 0; indefinite( n ) || i < n; ++i )
    {
        for ( tests::iterator pos = specification.begin(); pos != specification.end() ; ++pos )
        {
            test & testing = *pos;

            if ( select( testing.name, in ) )
                if ( abort( perform( testing ) ) )
                    return perform;
        }
    }
    return perform;
}